

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ltable.c
# Opt level: O3

lu_byte luaH_getint(Table *t,lua_Integer key,TValue *res)

{
  Value *pVVar1;
  byte bVar2;
  TValue *pTVar3;
  TValue *io2;
  TValue *io1;
  ulong uVar4;
  
  if (((int)key == 0) || ((ulong)t->asize <= key - 1U)) {
    pTVar3 = getintfromhash(t,key);
    bVar2 = pTVar3->tt_;
    if ((bVar2 & 0xf) != 0) {
      res->value_ = pTVar3->value_;
      bVar2 = pTVar3->tt_;
      res->tt_ = bVar2;
    }
    bVar2 = bVar2 & 0x3f;
  }
  else {
    pVVar1 = t->array;
    uVar4 = (ulong)((int)key - 1);
    bVar2 = *(byte *)((long)pVVar1 + uVar4 + 4);
    if ((bVar2 & 0xf) != 0) {
      res->tt_ = bVar2;
      res->value_ = pVVar1[-1 - uVar4];
    }
  }
  return bVar2;
}

Assistant:

lu_byte luaH_getint (Table *t, lua_Integer key, TValue *res) {
  unsigned k = ikeyinarray(t, key);
  if (k > 0) {
    lu_byte tag = *getArrTag(t, k - 1);
    if (!tagisempty(tag))
      farr2val(t, k - 1, tag, res);
    return tag;
  }
  else
    return finishnodeget(getintfromhash(t, key), res);
}